

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall icu_63::UVector::_init(UVector *this,int32_t initialCapacity,UErrorCode *status)

{
  UElement *pUVar1;
  int iVar2;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  iVar2 = 8;
  if (0xf0000000 < initialCapacity + 0xf0000000U) {
    iVar2 = initialCapacity;
  }
  pUVar1 = (UElement *)uprv_malloc_63((ulong)(uint)(iVar2 * 8));
  this->elements = pUVar1;
  if (pUVar1 == (UElement *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    this->capacity = iVar2;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }